

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void BasicTests::readNetworkTest(char *networkSourceFile)

{
  Graph *this;
  allocator local_31;
  string local_30;
  
  this = (Graph *)operator_new(0x88);
  Graph::Graph(this);
  std::__cxx11::string::string((string *)&local_30,networkSourceFile,&local_31);
  Graph::input_read(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void BasicTests::readNetworkTest(char *networkSourceFile) {
    Graph *g = new Graph();
    g->input_read(networkSourceFile);
}